

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall Memory::HeapInfo::SetDisableThreadAccessCheck(HeapInfo *this)

{
  (**(this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
     _vptr_PageAllocatorBase)(&this->recyclerPageAllocator);
  (**(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
     _vptr_PageAllocatorBase)(&this->recyclerLargeBlockPageAllocator);
  (**(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
     _vptr_PageAllocatorBase)(&this->recyclerWithBarrierPageAllocator);
  return;
}

Assistant:

void
HeapInfo::SetDisableThreadAccessCheck()
{
    ForEachNonLeafPageAllocator([](IdleDecommitPageAllocator* pageAlloc)
    {
        pageAlloc->SetDisableThreadAccessCheck();
    });
}